

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode Curl_update_timer(Curl_multi *multi)

{
  undefined8 uVar1;
  undefined4 uVar2;
  int iVar3;
  timediff_t tVar4;
  byte bVar5;
  CURLMcode CVar6;
  curltime newer;
  curltime older;
  curltime expire_ts;
  long timeout_ms;
  
  CVar6 = CURLM_OK;
  if ((multi->timer_cb != (curl_multi_timer_callback)0x0) && ((multi->field_0x279 & 0x10) == 0)) {
    multi_timeout(multi,&expire_ts,&timeout_ms);
    if (timeout_ms < 0) {
      if (multi->last_timeout_ms < 0) {
        return CURLM_OK;
      }
      timeout_ms = -1;
    }
    else if ((-1 < multi->last_timeout_ms) &&
            (uVar1 = (multi->last_expire_ts).tv_sec, uVar2 = (multi->last_expire_ts).tv_usec,
            newer.tv_usec = uVar2, newer.tv_sec = uVar1, older.tv_sec._4_4_ = expire_ts.tv_sec._4_4_
            , older.tv_sec._0_4_ = (undefined4)expire_ts.tv_sec, older.tv_usec = expire_ts.tv_usec,
            newer._12_4_ = 0, older._12_4_ = 0, tVar4 = Curl_timediff_us(newer,older), tVar4 == 0))
    {
      return CURLM_OK;
    }
    *(undefined4 *)&(multi->last_expire_ts).tv_sec = (undefined4)expire_ts.tv_sec;
    *(undefined4 *)((long)&(multi->last_expire_ts).tv_sec + 4) = expire_ts.tv_sec._4_4_;
    (multi->last_expire_ts).tv_usec = expire_ts.tv_usec;
    *(undefined4 *)&(multi->last_expire_ts).field_0xc = expire_ts._12_4_;
    multi->last_timeout_ms = timeout_ms;
    multi->field_0x279 = multi->field_0x279 | 4;
    iVar3 = (*multi->timer_cb)(multi,timeout_ms,multi->timer_userp);
    bVar5 = multi->field_0x279 & 0xfb;
    multi->field_0x279 = bVar5;
    CVar6 = CURLM_OK;
    if (iVar3 == -1) {
      multi->field_0x279 = bVar5 | 0x10;
      CVar6 = CURLM_ABORTED_BY_CALLBACK;
    }
  }
  return CVar6;
}

Assistant:

CURLMcode Curl_update_timer(struct Curl_multi *multi)
{
  struct curltime expire_ts;
  long timeout_ms;
  int rc;
  bool set_value = FALSE;

  if(!multi->timer_cb || multi->dead)
    return CURLM_OK;
  if(multi_timeout(multi, &expire_ts, &timeout_ms)) {
    return CURLM_OK;
  }

  if(timeout_ms < 0 && multi->last_timeout_ms < 0) {
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), still no timeout, no change\n");
#endif
  }
  else if(timeout_ms < 0) {
    /* there is no timeout now but there was one previously */
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), remove timeout, "
        " last_timeout=%ldms\n", multi->last_timeout_ms);
#endif
    timeout_ms = -1; /* normalize */
    set_value = TRUE;
  }
  else if(multi->last_timeout_ms < 0) {
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), had no timeout, set now\n");
#endif
    set_value = TRUE;
  }
  else if(Curl_timediff_us(multi->last_expire_ts, expire_ts)) {
    /* We had a timeout before and have one now, the absolute timestamp
     * differs. The relative timeout_ms may be the same, but the starting
     * point differs. Let the application restart its timer. */
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), expire timestamp changed\n");
#endif
    set_value = TRUE;
  }
  else {
    /* We have same expire time as previously. Our relative 'timeout_ms'
     * may be different now, but the application has the timer running
     * and we do not to tell it to start this again. */
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), same expire timestamp, no change\n");
#endif
  }

  if(set_value) {
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), set timeout %ldms\n", timeout_ms);
#endif
    multi->last_expire_ts = expire_ts;
    multi->last_timeout_ms = timeout_ms;
    set_in_callback(multi, TRUE);
    rc = multi->timer_cb(multi, timeout_ms, multi->timer_userp);
    set_in_callback(multi, FALSE);
    if(rc == -1) {
      multi->dead = TRUE;
      return CURLM_ABORTED_BY_CALLBACK;
    }
  }
  return CURLM_OK;
}